

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cc
# Opt level: O2

void __thiscall flow::lang::SymbolTable::~SymbolTable(SymbolTable *this)

{
  std::__cxx11::string::~string((string *)&this->name_);
  std::
  vector<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>,_std::allocator<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>_>_>
  ::~vector(&this->symbols_);
  return;
}

Assistant:

SymbolTable::~SymbolTable() {
}